

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetStencilOpLiteralName(STENCIL_OP StencilOp)

{
  Char *Message;
  char (*in_R8) [2];
  int local_3c;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  STENCIL_OP StencilOp_local;
  
  switch(StencilOp) {
  case STENCIL_OP_UNDEFINED:
    pcStack_10 = "STENCIL_OP_UNDEFINED";
    break;
  case STENCIL_OP_KEEP:
    pcStack_10 = "STENCIL_OP_KEEP";
    break;
  case STENCIL_OP_ZERO:
    pcStack_10 = "STENCIL_OP_ZERO";
    break;
  case STENCIL_OP_REPLACE:
    pcStack_10 = "STENCIL_OP_REPLACE";
    break;
  case STENCIL_OP_INCR_SAT:
    pcStack_10 = "STENCIL_OP_INCR_SAT";
    break;
  case STENCIL_OP_DECR_SAT:
    pcStack_10 = "STENCIL_OP_DECR_SAT";
    break;
  case STENCIL_OP_INVERT:
    pcStack_10 = "STENCIL_OP_INVERT";
    break;
  case STENCIL_OP_INCR_WRAP:
    pcStack_10 = "STENCIL_OP_INCR_WRAP";
    break;
  case STENCIL_OP_DECR_WRAP:
    pcStack_10 = "STENCIL_OP_DECR_WRAP";
    break;
  default:
    local_3c = (int)(char)StencilOp;
    msg.field_2._M_local_buf[0xf] = StencilOp;
    FormatString<char[31],unsigned_int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected stencil operation (",
               (char (*) [31])&local_3c,(uint *)0xcabce5,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetStencilOpLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x3cb);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetStencilOpLiteralName(STENCIL_OP StencilOp)
{
#define STENCIL_OP_TO_STR(Op) \
    case Op: return #Op

    static_assert(STENCIL_OP_NUM_OPS == 9, "Please update the switch below to handle the new stencil op");
    switch (StencilOp)
    {
        STENCIL_OP_TO_STR(STENCIL_OP_UNDEFINED);
        STENCIL_OP_TO_STR(STENCIL_OP_KEEP);
        STENCIL_OP_TO_STR(STENCIL_OP_ZERO);
        STENCIL_OP_TO_STR(STENCIL_OP_REPLACE);
        STENCIL_OP_TO_STR(STENCIL_OP_INCR_SAT);
        STENCIL_OP_TO_STR(STENCIL_OP_DECR_SAT);
        STENCIL_OP_TO_STR(STENCIL_OP_INVERT);
        STENCIL_OP_TO_STR(STENCIL_OP_INCR_WRAP);
        STENCIL_OP_TO_STR(STENCIL_OP_DECR_WRAP);

        default:
            UNEXPECTED("Unexpected stencil operation (", static_cast<Uint32>(StencilOp), ")");
            return "UNKNOWN";
    }
#undef STENCIL_OP_TO_STR
}